

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O0

int ptls_handle_message(ptls_t *tls,ptls_buffer_t *sendbuf,size_t *epoch_offsets,size_t in_epoch,
                       void *input,size_t inlen,ptls_handshake_properties_t *properties)

{
  ptls_private_key_method_t *ppVar1;
  size_t sVar2;
  ptls_private_key_method_t *method;
  undefined1 local_90 [4];
  int rc;
  st_ptls_record_t rec;
  st_ptls_raw_message_emitter_t emitter;
  size_t inlen_local;
  void *input_local;
  size_t in_epoch_local;
  size_t *epoch_offsets_local;
  ptls_buffer_t *sendbuf_local;
  ptls_t *tls_local;
  
  local_90[0] = '\x16';
  local_90._2_2_ = 0;
  rec._0_8_ = inlen;
  rec.length = (size_t)input;
  rec.fragment = (uint8_t *)sendbuf;
  if (input == (void *)0x0) {
    tls_local._4_4_ =
         send_client_hello(tls,(ptls_message_emitter_t *)&rec.fragment,properties,
                           (ptls_iovec_t *)0x0);
  }
  else {
    sVar2 = ptls_get_read_epoch(tls);
    if (sVar2 == in_epoch) {
      ppVar1 = tls->ctx->private_key_method;
      tls->ctx->private_key_method = (ptls_private_key_method_t *)0x0;
      tls_local._4_4_ =
           handle_handshake_record
                     (tls,handle_handshake_message,(ptls_message_emitter_t *)&rec.fragment,
                      (st_ptls_record_t *)local_90,properties);
      tls->ctx->private_key_method = ppVar1;
    }
    else {
      tls_local._4_4_ = 10;
    }
  }
  return tls_local._4_4_;
}

Assistant:

int ptls_handle_message(ptls_t *tls, ptls_buffer_t *sendbuf, size_t epoch_offsets[5], size_t in_epoch, const void *input,
                        size_t inlen, ptls_handshake_properties_t *properties)
{
    struct st_ptls_raw_message_emitter_t emitter = {
        {sendbuf, &tls->traffic_protection.enc, 0, begin_raw_message, commit_raw_message}, SIZE_MAX, epoch_offsets};
    struct st_ptls_record_t rec = {PTLS_CONTENT_TYPE_HANDSHAKE, 0, inlen, input};

    if (input == NULL)
        return send_client_hello(tls, &emitter.super, properties, NULL);

    if (ptls_get_read_epoch(tls) != in_epoch)
        return PTLS_ALERT_UNEXPECTED_MESSAGE;

    /* This is a back-door so do not handle private keys here.  */
    int rc;
    ptls_private_key_method_t *method = tls->ctx->private_key_method;
    tls->ctx->private_key_method = NULL;
    rc = handle_handshake_record(tls, handle_handshake_message, &emitter.super, &rec, properties);
    tls->ctx->private_key_method = method;
    return rc;
}